

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

object __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this)

{
  accessor<pybind11::detail::accessor_policies::str_attr> *in_RSI;
  tuple result;
  object oStack_18;
  
  tuple::tuple((tuple *)&oStack_18,0);
  accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(in_RSI);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,(PyObject *)&oStack_18);
  object::~object(&oStack_18);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}